

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketLog.cpp
# Opt level: O3

void __thiscall SocketLog::SocketLog(SocketLog *this)

{
  int iVar1;
  TCPAcceptor *pTVar2;
  
  this->port = 0x1a0a;
  this->acceptor = (TCPAcceptor *)0x0;
  this->inited = false;
  memset(&this->connectedStreams,0,0x90);
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_initialize_map((_Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&this->msgQueue,0);
  *(undefined8 *)((long)&(this->msgQueueMutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->msgQueueMutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->msgQueueMutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->msgQueueMutex).super___mutex_base._M_mutex + 8) = 0;
  (this->msgQueueMutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&this->msgQueueCondition);
  (this->sendInterceptor).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->sendInterceptor)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->sendInterceptor).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->sendInterceptor).super__Function_base._M_functor + 8) = 0;
  signal(0xd,(__sighandler_t)0x1);
  while( true ) {
    pTVar2 = (TCPAcceptor *)operator_new(0x30);
    TCPAcceptor::TCPAcceptor(pTVar2,this->port,"");
    this->acceptor = pTVar2;
    iVar1 = TCPAcceptor::start(pTVar2);
    if (iVar1 == 0) break;
    printf("SocketLog start failed! check your port:%d",(ulong)(uint)this->port);
    putchar(10);
    this->inited = false;
    pTVar2 = this->acceptor;
    if (pTVar2 != (TCPAcceptor *)0x0) {
      TCPAcceptor::~TCPAcceptor(pTVar2);
    }
    operator_delete(pTVar2);
    this->acceptor = (TCPAcceptor *)0x0;
    this->port = this->port + 1;
  }
  printf("SocketLog start success! port:%d",(ulong)(uint)this->port);
  putchar(10);
  startAcceptThread(this);
  startSendThread(this);
  this->inited = true;
  return;
}

Assistant:

SocketLog::SocketLog() {
    signal(SIGPIPE, SIG_IGN);

    START:
    acceptor = new TCPAcceptor(port);

    if (acceptor->start() == 0) {
        LOG("SocketLog start success! port:%d", port);
        startAcceptThread();
        startSendThread();
        inited = true;
    } else {
        LOGE("SocketLog start failed! check your port:%d", port);
        inited = false;
        delete acceptor;
        acceptor = nullptr;

        port++;
        goto START;
    }
}